

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall doctest::detail::ContextState::finalizeTestCaseData(ContextState *this)

{
  bool bVar1;
  int iVar2;
  Approx *pAVar3;
  double dVar4;
  bool local_51;
  undefined1 local_40 [7];
  bool ok_to_fail;
  Approx local_28;
  ContextState *local_10;
  ContextState *this_local;
  
  local_10 = this;
  dVar4 = Timer::getElapsedSeconds(&this->timer);
  (this->super_CurrentTestCaseStats).seconds = dVar4;
  iVar2 = MultiLaneAtomic::operator_cast_to_int
                    ((MultiLaneAtomic *)&this->numAssertsCurrentTest_atomic);
  *(int *)&this->field_0x9c = iVar2 + *(int *)&this->field_0x9c;
  iVar2 = MultiLaneAtomic::operator_cast_to_int
                    ((MultiLaneAtomic *)&this->numAssertsFailedCurrentTest_atomic);
  *(int *)&this->field_0xa0 = iVar2 + *(int *)&this->field_0xa0;
  iVar2 = MultiLaneAtomic::operator_cast_to_int
                    ((MultiLaneAtomic *)&this->numAssertsCurrentTest_atomic);
  (this->super_CurrentTestCaseStats).numAssertsCurrentTest = iVar2;
  iVar2 = MultiLaneAtomic::operator_cast_to_int
                    ((MultiLaneAtomic *)&this->numAssertsFailedCurrentTest_atomic);
  (this->super_CurrentTestCaseStats).numAssertsFailedCurrentTest = iVar2;
  if ((this->super_CurrentTestCaseStats).numAssertsFailedCurrentTest != 0) {
    (this->super_CurrentTestCaseStats).failure_flags =
         (this->super_CurrentTestCaseStats).failure_flags | 1;
  }
  Approx::Approx(&local_28,
                 (((this->super_ContextOptions).currentTest)->super_TestCaseData).m_timeout);
  pAVar3 = Approx::epsilon(&local_28,2.220446049250313e-16);
  bVar1 = doctest::operator!=(pAVar3,0.0);
  local_51 = false;
  if (bVar1) {
    Approx::Approx((Approx *)local_40,(this->super_CurrentTestCaseStats).seconds);
    pAVar3 = Approx::epsilon((Approx *)local_40,2.220446049250313e-16);
    local_51 = operator>(pAVar3,(((this->super_ContextOptions).currentTest)->super_TestCaseData).
                                m_timeout);
  }
  if (local_51 != false) {
    (this->super_CurrentTestCaseStats).failure_flags =
         (this->super_CurrentTestCaseStats).failure_flags | 0x10;
  }
  if (((((this->super_ContextOptions).currentTest)->super_TestCaseData).m_should_fail & 1U) == 0) {
    if (((this->super_CurrentTestCaseStats).failure_flags == 0) ||
       (((((this->super_ContextOptions).currentTest)->super_TestCaseData).m_may_fail & 1U) == 0)) {
      if (0 < (((this->super_ContextOptions).currentTest)->super_TestCaseData).m_expected_failures)
      {
        if ((this->super_CurrentTestCaseStats).numAssertsFailedCurrentTest ==
            (((this->super_ContextOptions).currentTest)->super_TestCaseData).m_expected_failures) {
          (this->super_CurrentTestCaseStats).failure_flags =
               (this->super_CurrentTestCaseStats).failure_flags | 0x100;
        }
        else {
          (this->super_CurrentTestCaseStats).failure_flags =
               (this->super_CurrentTestCaseStats).failure_flags | 0x80;
        }
      }
    }
    else {
      (this->super_CurrentTestCaseStats).failure_flags =
           (this->super_CurrentTestCaseStats).failure_flags | 0x200;
    }
  }
  else if ((this->super_CurrentTestCaseStats).failure_flags == 0) {
    (this->super_CurrentTestCaseStats).failure_flags =
         (this->super_CurrentTestCaseStats).failure_flags | 0x20;
  }
  else {
    (this->super_CurrentTestCaseStats).failure_flags =
         (this->super_CurrentTestCaseStats).failure_flags | 0x40;
  }
  bVar1 = true;
  if ((((this->super_CurrentTestCaseStats).failure_flags & 0x40U) == 0) &&
     (bVar1 = true, ((this->super_CurrentTestCaseStats).failure_flags & 0x200U) == 0)) {
    bVar1 = ((this->super_CurrentTestCaseStats).failure_flags & 0x100U) != 0;
  }
  if (((this->super_CurrentTestCaseStats).failure_flags != 0) && (!bVar1)) {
    *(int *)&this->field_0x98 = *(int *)&this->field_0x98 + 1;
  }
  return;
}

Assistant:

void finalizeTestCaseData() {
            seconds = timer.getElapsedSeconds();

            // update the non-atomic counters
            numAsserts += numAssertsCurrentTest_atomic;
            numAssertsFailed += numAssertsFailedCurrentTest_atomic;
            numAssertsCurrentTest       = numAssertsCurrentTest_atomic;
            numAssertsFailedCurrentTest = numAssertsFailedCurrentTest_atomic;

            if(numAssertsFailedCurrentTest)
                failure_flags |= TestCaseFailureReason::AssertFailure;

            if(Approx(currentTest->m_timeout).epsilon(DBL_EPSILON) != 0 &&
               Approx(seconds).epsilon(DBL_EPSILON) > currentTest->m_timeout)
                failure_flags |= TestCaseFailureReason::Timeout;

            if(currentTest->m_should_fail) {
                if(failure_flags) {
                    failure_flags |= TestCaseFailureReason::ShouldHaveFailedAndDid;
                } else {
                    failure_flags |= TestCaseFailureReason::ShouldHaveFailedButDidnt;
                }
            } else if(failure_flags && currentTest->m_may_fail) {
                failure_flags |= TestCaseFailureReason::CouldHaveFailedAndDid;
            } else if(currentTest->m_expected_failures > 0) {
                if(numAssertsFailedCurrentTest == currentTest->m_expected_failures) {
                    failure_flags |= TestCaseFailureReason::FailedExactlyNumTimes;
                } else {
                    failure_flags |= TestCaseFailureReason::DidntFailExactlyNumTimes;
                }
            }

            bool ok_to_fail = (TestCaseFailureReason::ShouldHaveFailedAndDid & failure_flags) ||
                              (TestCaseFailureReason::CouldHaveFailedAndDid & failure_flags) ||
                              (TestCaseFailureReason::FailedExactlyNumTimes & failure_flags);

            // if any subcase has failed - the whole test case has failed
            if(failure_flags && !ok_to_fail)
                numTestCasesFailed++;
        }